

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O2

int secp256k1_ec_seckey_tweak_add_helper(secp256k1_scalar *sec,uchar *tweak32)

{
  secp256k1_scalar *r;
  int iVar1;
  uint uVar2;
  ulong in_RAX;
  int overflow;
  secp256k1_scalar term;
  undefined8 local_28;
  
  local_28 = in_RAX & 0xffffffff00000000;
  r = (secp256k1_scalar *)((long)&local_28 + 4);
  secp256k1_scalar_set_b32(r,tweak32,(int *)&local_28);
  iVar1 = (int)local_28;
  secp256k1_scalar_add(sec,sec,r);
  uVar2 = secp256k1_scalar_is_zero(sec);
  uVar2 = uVar2 ^ 1;
  if (iVar1 != 0) {
    uVar2 = 0;
  }
  secp256k1_scalar_clear(r);
  return uVar2;
}

Assistant:

static int secp256k1_ec_seckey_tweak_add_helper(secp256k1_scalar *sec, const unsigned char *tweak32) {
    secp256k1_scalar term;
    int overflow = 0;
    int ret = 0;

    secp256k1_scalar_set_b32(&term, tweak32, &overflow);
    ret = (!overflow) & secp256k1_eckey_privkey_tweak_add(sec, &term);
    secp256k1_scalar_clear(&term);
    return ret;
}